

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  bool bVar3;
  bool ordOutput;
  FILE *fout [3];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parquetOutFiles;
  sigaction sa;
  allocator local_161;
  undefined8 local_160;
  FILE *local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  string local_138;
  string local_118;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  _union_1457 local_c8;
  undefined1 local_c0 [128];
  undefined4 local_40;
  
  local_158 = (FILE *)0x0;
  uStack_150 = 0;
  local_148 = 0;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f8._M_impl.super__Rb_tree_header._M_header;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_160 = 0;
  local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  ordOutput = false;
  local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = false;
switchD_0010659e_caseD_6d:
  while( true ) {
    bVar3 = bVar1;
    iVar2 = getopt(argc,argv,"HvhM:m:Q:q:S:s:");
    if (0x50 < iVar2) goto code_r0x00106594;
    if (iVar2 == -1) {
      if (!bVar3) {
        memset(&local_c8,0,0x98);
        sigemptyset((sigset_t *)local_c0);
        local_c8.sa_handler = segfault_sigaction;
        local_40 = 4;
        sigaction(0xb,(sigaction *)&local_c8,(sigaction *)0x0);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
        initstreams(&local_118,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        pltcalc::doit((bool)((byte)local_160 & 1),ordOutput,&local_158,
                      (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_f8);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_f8);
        return 0;
      }
      goto LAB_00106774;
    }
    if (iVar2 != 0x48) break;
    local_160 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
    bVar1 = bVar3;
  }
  if (iVar2 == 0x4d) {
    std::__cxx11::string::string((string *)&local_c8,_optarg,&local_161);
    iVar2 = 0;
    goto LAB_0010663e;
  }
  goto switchD_0010659e_caseD_6e;
code_r0x00106594:
  bVar1 = true;
  switch(iVar2) {
  case 0x6d:
  case 0x71:
  case 0x73:
    break;
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x74:
  case 0x75:
switchD_0010659e_caseD_6e:
    main_cold_4();
switchD_0010659e_caseD_76:
    main_cold_1();
LAB_00106774:
    main_cold_3();
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_f8);
    _Unwind_Resume(extraout_RAX);
  case 0x76:
    goto switchD_0010659e_caseD_76;
  default:
    if (iVar2 == 0x51) {
      std::__cxx11::string::string((string *)&local_c8,_optarg,&local_161);
      iVar2 = 2;
    }
    else {
      if (iVar2 != 0x53) goto switchD_0010659e_caseD_6e;
      std::__cxx11::string::string((string *)&local_c8,_optarg,&local_161);
      iVar2 = 1;
    }
LAB_0010663e:
    openpipe(iVar2,(string *)&local_c8,&local_158);
    if (local_c8.sa_handler != (__sighandler_t)(local_c0 + 8)) {
      operator_delete(local_c8.sa_handler);
    }
    ordOutput = true;
    bVar1 = bVar3;
  }
  goto switchD_0010659e_caseD_6d;
}

Assistant:

int main(int argc, char *argv[])
{

	enum { MPLT = 0, SPLT, QPLT };

	int opt;
	bool skipHeader = false;
	bool ordOutput = false;
	FILE * fout[] = { nullptr, nullptr, nullptr };
	bool parquetOutput = false;
	std::map<int, std::string> parquetOutFiles;
	while ((opt = getopt(argc, argv, "HvhM:m:Q:q:S:s:")) != -1) {
		switch (opt) {
		case 'v':
#ifdef HAVE_PARQUET
			fprintf(stderr, "%s : version: %s : "
					"Parquet output enabled\n",
				argv[0], VERSION);
#else
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
#endif
			::exit(EXIT_FAILURE);
			break;
		case 'M':
			ordOutput = true;
			openpipe(MPLT, optarg, fout);
			break;
		case 'm':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::MPLT] = optarg;
#endif
			break;
		case 'Q':
			ordOutput = true;
			openpipe(QPLT, optarg, fout);
			break;
		case 'q':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::QPLT] = optarg;
#endif
			break;
		case 'S':
			ordOutput = true;
			openpipe(SPLT, optarg, fout);
			break;
		case 's':
			parquetOutput = true;
#ifdef HAVE_PARQUET
			parquetOutFiles[OasisParquet::SPLT] = optarg;
#endif
			break;
		case 'H':
			skipHeader = true;
			break;
		case 'h':
		default:
			help();
			::exit(EXIT_FAILURE);
		}
	}

#ifndef HAVE_PARQUET
	if (parquetOutput) {
		fprintf(stderr, "FATAL: Apache arrow libraries for parquet "
				"output are missing.\nPlease install libraries "
				"and recompile to use this option.\n");
		exit(EXIT_FAILURE);
	}
#endif

#if !defined(_MSC_VER) && !defined(__MINGW32__)
	struct sigaction sa;

	memset(&sa, 0, sizeof(struct sigaction));
	sigemptyset(&sa.sa_mask);
	sa.sa_sigaction = segfault_sigaction;
	sa.sa_flags = SA_SIGINFO;

	sigaction(SIGSEGV, &sa, NULL);
#endif

	try {
		initstreams();
		pltcalc::doit(skipHeader, ordOutput, fout, parquetOutFiles);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}